

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O0

void __thiscall
toml::result<toml::value_t,_toml::error_info>::cleanup
          (result<toml::value_t,_toml::error_info> *this,EVP_PKEY_CTX *ctx)

{
  if ((this->is_ok_ & 1U) == 0) {
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6ac1a8);
  }
  return;
}

Assistant:

void cleanup() noexcept
    {
#if defined(__GNUC__) && ! defined(__clang__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wduplicated-branches"
#endif

        if(this->is_ok_) {this->succ_.~success_type();}
        else             {this->fail_.~failure_type();}

#if defined(__GNUC__) && ! defined(__clang__)
#pragma GCC diagnostic pop
#endif
        return;
    }